

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

tuple<int,_unsigned_long> compare(uchar *a,uchar *b,size_t depth)

{
  long in_RCX;
  tuple<int,_unsigned_long> tVar1;
  int local_38;
  byte local_32;
  byte local_31;
  uchar B;
  long lStack_30;
  uchar A;
  size_t i;
  size_t depth_local;
  uchar *b_local;
  uchar *a_local;
  
  depth_local = depth;
  b_local = b;
  a_local = a;
  if (b == (uchar *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x69,"std::tuple<int, lcp_t> compare(unsigned char *, unsigned char *, size_t)");
  }
  lStack_30 = in_RCX;
  if (depth == 0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x69,"std::tuple<int, lcp_t> compare(unsigned char *, unsigned char *, size_t)");
  }
  while( true ) {
    local_31 = b[lStack_30];
    local_32 = *(byte *)(depth + lStack_30);
    if ((local_31 == 0) || (local_31 != local_32)) break;
    lStack_30 = lStack_30 + 1;
  }
  local_38 = (uint)local_31 - (uint)local_32;
  tVar1 = std::make_tuple<int,unsigned_long&>((int *)a,(unsigned_long *)&local_38);
  tVar1.super__Tuple_impl<0UL,_int,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)a;
  return (tuple<int,_unsigned_long>)tVar1.super__Tuple_impl<0UL,_int,_unsigned_long>;
}

Assistant:

std::tuple<int, lcp_t>
compare(unsigned char* a, unsigned char* b, size_t depth=0)
{
	assert(a); assert(b);
	for (size_t i=depth; ; ++i) {
		const unsigned char A = a[i];
		const unsigned char B = b[i];
		if (A == 0 or A != B) {
			return std::make_tuple(int(A)-int(B), i);
		}
	}
	assert(0);
	return std::make_tuple(int(-1), lcp_t(-1));
}